

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connect-unspecified.c
# Opt level: O1

int run_test_connect_unspecified(void)

{
  short sVar1;
  int iVar2;
  undefined8 uVar3;
  ulong uVar4;
  short *psVar5;
  code **ppcVar6;
  bool bVar7;
  int64_t eval_b_4;
  int64_t eval_b_5;
  sockaddr_in6 addr6;
  sockaddr_in addr4;
  uv_connect_t connect6;
  uv_connect_t connect4;
  uv_tcp_t socket6;
  uv_tcp_t socket4;
  code *apcStack_2f8 [2];
  undefined8 uStack_2e8;
  code *pcStack_2e0;
  long local_2d0;
  long local_2c8;
  undefined8 local_2c0 [4];
  undefined1 local_2a0 [16];
  long local_290 [13];
  undefined8 local_228 [13];
  long local_1c0 [27];
  undefined1 local_e8 [216];
  
  pcStack_2e0 = (code *)0x183ea6;
  uVar3 = uv_default_loop();
  pcStack_2e0 = (code *)0x183eb9;
  iVar2 = uv_tcp_init(uVar3,local_e8);
  local_1c0[0] = (long)iVar2;
  local_228[0] = 0;
  if (local_1c0[0] == 0) {
    pcStack_2e0 = (code *)0x183efb;
    iVar2 = uv_ip4_addr("0.0.0.0",0x23a3,local_2a0);
    local_1c0[0] = (long)iVar2;
    local_228[0] = 0;
    if (local_1c0[0] != 0) goto LAB_00184123;
    pcStack_2e0 = (code *)0x183f48;
    iVar2 = uv_tcp_connect(local_228,local_e8,local_2a0,connect_4);
    local_1c0[0] = (long)iVar2;
    local_290[0] = 0;
    if (local_1c0[0] != 0) goto LAB_00184138;
    pcStack_2e0 = (code *)0x183f80;
    iVar2 = uv_interface_addresses(local_1c0,local_290);
    if (iVar2 != 0) {
LAB_00183f84:
      pcStack_2e0 = (code *)0x183f8e;
      iVar2 = uv_run(uVar3,0);
      local_2d0 = (long)iVar2;
      local_2c8 = 0;
      if (local_2d0 != 0) goto LAB_0018414a;
      pcStack_2e0 = (code *)0x183fbf;
      uv_walk(uVar3,close_walk_cb,0);
      pcStack_2e0 = (code *)0x183fc9;
      uv_run(uVar3,0);
      local_2d0 = 0;
      pcStack_2e0 = (code *)0x183fda;
      iVar2 = uv_loop_close(uVar3);
      local_2c8 = (long)iVar2;
      if (local_2d0 == local_2c8) {
        pcStack_2e0 = (code *)0x183ff6;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00184159;
    }
    if ((long)(int)local_290[0] < 1) {
LAB_00184104:
      pcStack_2e0 = (code *)0x184109;
      uv_free_interface_addresses();
      goto LAB_00183f84;
    }
    psVar5 = (short *)(local_1c0[0] + 0x14);
    uVar4 = 1;
    do {
      sVar1 = *psVar5;
      if (sVar1 == 10) break;
      psVar5 = psVar5 + 0x30;
      bVar7 = uVar4 < (ulong)(long)(int)local_290[0];
      uVar4 = uVar4 + 1;
    } while (bVar7);
    pcStack_2e0 = (code *)0x184047;
    uv_free_interface_addresses(local_1c0[0]);
    if (sVar1 != 10) goto LAB_00183f84;
    pcStack_2e0 = (code *)0x184061;
    iVar2 = uv_tcp_init(uVar3,local_1c0);
    local_290[0] = (long)iVar2;
    local_2c0[0] = 0;
    if (local_290[0] == 0) {
      pcStack_2e0 = (code *)0x184097;
      iVar2 = uv_ip6_addr("::",0x23a3,local_2c0);
      local_290[0] = (long)iVar2;
      local_2d0 = 0;
      if (local_290[0] != 0) goto LAB_00184177;
      pcStack_2e0 = (code *)0x1840d5;
      iVar2 = uv_tcp_connect(local_290,local_1c0,local_2c0,connect_6);
      local_2d0 = (long)iVar2;
      local_2c8 = 0;
      if (local_2d0 != 0) {
        pcStack_2e0 = (code *)0x184104;
        run_test_connect_unspecified_cold_6();
        goto LAB_00184104;
      }
      goto LAB_00183f84;
    }
  }
  else {
    pcStack_2e0 = (code *)0x184123;
    run_test_connect_unspecified_cold_1();
LAB_00184123:
    pcStack_2e0 = (code *)0x184138;
    run_test_connect_unspecified_cold_2();
LAB_00184138:
    pcStack_2e0 = (code *)0x18414a;
    run_test_connect_unspecified_cold_3();
LAB_0018414a:
    pcStack_2e0 = (code *)0x184159;
    run_test_connect_unspecified_cold_7();
LAB_00184159:
    pcStack_2e0 = (code *)0x184168;
    run_test_connect_unspecified_cold_8();
  }
  pcStack_2e0 = (code *)0x184177;
  run_test_connect_unspecified_cold_4();
LAB_00184177:
  iVar2 = (int)&local_2d0;
  pcStack_2e0 = connect_4;
  run_test_connect_unspecified_cold_5();
  pcStack_2e0 = (code *)(long)iVar2;
  uStack_2e8 = 0xffffffffffffff9d;
  if (pcStack_2e0 != (code *)0xffffffffffffff9d) {
    return iVar2;
  }
  iVar2 = (int)&uStack_2e8;
  apcStack_2f8[0] = connect_6;
  connect_4_cold_1();
  apcStack_2f8[0] = (code *)(long)iVar2;
  if (apcStack_2f8[0] != (code *)0xffffffffffffff9d) {
    return iVar2;
  }
  ppcVar6 = apcStack_2f8;
  connect_6_cold_1();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar2 = uv_close(ppcVar6,0);
  return iVar2;
}

Assistant:

TEST_IMPL(connect_unspecified) {
  uv_loop_t* loop;
  uv_tcp_t socket4;
  struct sockaddr_in addr4;
  uv_connect_t connect4;
  uv_tcp_t socket6;
  struct sockaddr_in6 addr6;
  uv_connect_t connect6;

  loop = uv_default_loop();

  ASSERT_OK(uv_tcp_init(loop, &socket4));
  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr4));
  ASSERT_OK(uv_tcp_connect(&connect4,
                           &socket4,
                           (const struct sockaddr*) &addr4,
                           connect_4));

  if (can_ipv6()) {
    ASSERT_OK(uv_tcp_init(loop, &socket6));
    ASSERT_OK(uv_ip6_addr("::", TEST_PORT, &addr6));
    ASSERT_OK(uv_tcp_connect(&connect6,
                             &socket6,
                             (const struct sockaddr*) &addr6,
                             connect_6));
  }

  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}